

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureSpecificationTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles31::Functional::TextureSpecCase::iterate(TextureSpecCase *this)

{
  ContextWrapper *this_00;
  RenderContext *context;
  TestLog *log;
  int iVar1;
  deUint32 dVar2;
  int iVar3;
  undefined4 extraout_var;
  TestError *this_01;
  NotSupportedError *this_02;
  deUint32 height;
  ReferenceContext *pRVar5;
  ApiType width;
  Random rnd;
  MultisamplePixelBufferAccess local_6498;
  MultisamplePixelBufferAccess local_6470;
  MultisamplePixelBufferAccess local_6448;
  ReferenceContextBuffers refBuffers;
  ReferenceContextLimits local_63a8;
  GLContext gles31Context;
  ReferenceContext refContext;
  deUint32 *pdVar4;
  
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar1 = (*context->_vptr_RenderContext[4])(context);
  pdVar4 = (deUint32 *)CONCAT44(extraout_var,iVar1);
  if (((int)*pdVar4 < 0x100) || ((int)pdVar4[1] < 0x100)) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_02,"Too small viewport",SSBOArrayLengthTests::init::arraysSized + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureSpecificationTests.cpp"
               ,0x8d);
  }
  else {
    log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
    if ((char)iVar1 != '\0') {
      dVar2 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus.
                           _M_p);
      deRandom_init(&rnd.m_rnd,dVar2);
      dVar2 = *pdVar4;
      width.m_bits = 0x100;
      if ((int)dVar2 < 0x100) {
        width.m_bits = dVar2;
      }
      height = 0x100;
      if ((int)pdVar4[1] < 0x100) {
        height = pdVar4[1];
      }
      iVar1 = de::Random::getInt((Random *)&rnd.m_rnd,0,dVar2 - width.m_bits);
      iVar3 = de::Random::getInt(&rnd,0,pdVar4[1] - height);
      refContext.super_Context._vptr_Context = (_func_int **)CONCAT44(iVar3,iVar1);
      refContext.super_Context.m_type.super_ApiType.m_bits = (ApiType)(ApiType)width.m_bits;
      refContext.super_Context._12_4_ = height;
      sglr::GLContext::GLContext(&gles31Context,context,log,1,(IVec4 *)&refContext);
      refContext.super_Context._12_4_ = (uint)(pdVar4[5] != 0) << 3;
      refContext.super_Context._vptr_Context = (_func_int **)0x800000008;
      refContext.super_Context.m_type.super_ApiType.m_bits = (ApiType)8;
      sglr::ReferenceContextBuffers::ReferenceContextBuffers
                (&refBuffers,(PixelFormat *)&refContext,0,0,width.m_bits,height,1);
      sglr::ReferenceContextLimits::ReferenceContextLimits(&local_63a8,context);
      sglr::ReferenceContextBuffers::getColorbuffer(&local_6448,&refBuffers);
      sglr::ReferenceContextBuffers::getDepthbuffer(&local_6470,&refBuffers);
      sglr::ReferenceContextBuffers::getStencilbuffer(&local_6498,&refBuffers);
      sglr::ReferenceContext::ReferenceContext
                (&refContext,&local_63a8,&local_6448,&local_6470,&local_6498);
      sglr::ReferenceContextLimits::~ReferenceContextLimits(&local_63a8);
      this_00 = &this->super_ContextWrapper;
      iVar1 = 2;
      while (iVar1 != 0) {
        pRVar5 = &refContext;
        if (iVar1 == 2) {
          pRVar5 = (ReferenceContext *)&gles31Context;
        }
        sglr::ContextWrapper::setContext(this_00,&pRVar5->super_Context);
        sglr::ContextWrapper::glClearColor(this_00,0.125,0.25,0.5,1.0);
        sglr::ContextWrapper::glClear(this_00,0x4500);
        iVar1 = iVar1 + -1;
      }
      iVar1 = 2;
      do {
        if (iVar1 == 0) {
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_PASS,"Pass");
          sglr::GLContext::enableLogging(&gles31Context,0);
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])
                    (this,&gles31Context,&refContext);
          sglr::ReferenceContext::~ReferenceContext(&refContext);
          sglr::ReferenceContextBuffers::~ReferenceContextBuffers(&refBuffers);
          sglr::GLContext::~GLContext(&gles31Context);
          return STOP;
        }
        pRVar5 = &refContext;
        if (iVar1 == 2) {
          pRVar5 = (ReferenceContext *)&gles31Context;
        }
        sglr::ContextWrapper::setContext(this_00,&pRVar5->super_Context);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
        dVar2 = sglr::ContextWrapper::glGetError(this_00);
        iVar1 = iVar1 + -1;
      } while (dVar2 == 0);
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,(char *)0x0,"glGetError() == GL_NO_ERROR",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureSpecificationTests.cpp"
                 ,0xab);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_02,"Extension not supported",SSBOArrayLengthTests::init::arraysSized + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureSpecificationTests.cpp"
               ,0x90);
  }
  __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TextureSpecCase::IterateResult TextureSpecCase::iterate (void)
{
	glu::RenderContext&			renderCtx				= TestCase::m_context.getRenderContext();
	const tcu::RenderTarget&	renderTarget			= renderCtx.getRenderTarget();
	tcu::TestLog&				log						= m_testCtx.getLog();

	if (renderTarget.getWidth() < VIEWPORT_WIDTH || renderTarget.getHeight() < VIEWPORT_HEIGHT)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	if (!checkExtensionSupport())
		throw tcu::NotSupportedError("Extension not supported", "", __FILE__, __LINE__);

	// Context size, and viewport for GLES3.1
	de::Random	rnd			(deStringHash(getName()));
	int			width		= deMin32(renderTarget.getWidth(),	VIEWPORT_WIDTH);
	int			height		= deMin32(renderTarget.getHeight(),	VIEWPORT_HEIGHT);
	int			x			= rnd.getInt(0, renderTarget.getWidth()		- width);
	int			y			= rnd.getInt(0, renderTarget.getHeight()	- height);

	// Contexts.
	sglr::GLContext					gles31Context	(renderCtx, log, sglr::GLCONTEXT_LOG_CALLS, tcu::IVec4(x, y, width, height));
	sglr::ReferenceContextBuffers	refBuffers		(tcu::PixelFormat(8,8,8,renderTarget.getPixelFormat().alphaBits?8:0), 0 /* depth */, 0 /* stencil */, width, height);
	sglr::ReferenceContext			refContext		(sglr::ReferenceContextLimits(renderCtx), refBuffers.getColorbuffer(), refBuffers.getDepthbuffer(), refBuffers.getStencilbuffer());

	// Clear color buffer.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		setContext(ndx ? (sglr::Context*)&refContext : (sglr::Context*)&gles31Context);
		glClearColor(0.125f, 0.25f, 0.5f, 1.0f);
		glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	}

	// Construct texture using both GLES3.1 and reference contexts.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		setContext(ndx ? (sglr::Context*)&refContext : (sglr::Context*)&gles31Context);
		createTexture();
		TCU_CHECK(glGetError() == GL_NO_ERROR);
	}

	// Initialize case result to pass.
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Disable logging.
	gles31Context.enableLogging(0);

	// Verify results.
	verifyTexture(gles31Context, refContext);

	return STOP;
}